

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PhysBCFunct.H
# Opt level: O3

void __thiscall
amrex::GpuBndryFuncFab<PeleLMFaceFillExtDir>::nddoit
          (GpuBndryFuncFab<PeleLMFaceFillExtDir> *this,Box *bx,FArrayBox *dest,int dcomp,int numcomp
          ,Geometry *geom,Real time,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,
          int bcomp,int orig_comp)

{
  Real RVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CoordType CVar5;
  undefined8 uVar6;
  double *pdVar7;
  pointer pBVar8;
  byte bVar9;
  int iVar10;
  Arena *pAVar11;
  undefined4 extraout_var;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  Real *pRVar20;
  GeometryData *pGVar21;
  long lVar22;
  ulong uVar23;
  int idim;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  byte bVar28;
  int iVar30;
  undefined1 auVar29 [16];
  Box bndry;
  AsyncArray<amrex::BCRec,_0> bcr_aa;
  BCRec *local_260;
  uint local_218 [6];
  undefined4 local_200;
  Real local_1f8;
  Real RStack_1f0;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  undefined8 local_1a8;
  int local_1a0;
  Box local_198;
  AsyncArray<amrex::BCRec,_0> local_178;
  Real local_168;
  Real RStack_160;
  Real local_158;
  Real RStack_150;
  Real local_148;
  Real RStack_140;
  undefined8 local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined8 uStack_124;
  anon_class_224_9_597d82ad local_110;
  
  bVar28 = 0;
  iVar2 = (bx->bigend).vect[0];
  uVar12 = *(ulong *)(bx->smallend).vect;
  iVar24 = (int)(uVar12 >> 0x20);
  uVar6 = *(undefined8 *)((bx->bigend).vect + 1);
  iVar10 = (int)uVar6;
  iVar30 = (int)((ulong)uVar6 >> 0x20);
  iVar3 = (bx->smallend).vect[2];
  local_1a8 = CONCAT44((iVar10 - iVar24) + 1,(iVar2 - (int)uVar12) + 1);
  local_1a0 = (iVar30 - iVar3) + 1;
  local_218[0] = (geom->domain).smallend.vect[0];
  local_1e0 = (ulong)local_218[0];
  local_218[1] = (geom->domain).smallend.vect[1];
  local_1b0 = (ulong)local_218[1];
  uVar14 = (geom->domain).btype.itype;
  iVar17 = (~uVar14 & 1) + (geom->domain).bigend.vect[0];
  local_218[4] = (geom->domain).bigend.vect[1] + (uint)((uVar14 & 2) == 0);
  local_1d0 = (ulong)local_218[4];
  local_218[5] = (geom->domain).bigend.vect[2] + (uint)((uVar14 & 4) == 0);
  local_1d8 = (ulong)local_218[5];
  local_218[2] = (geom->domain).smallend.vect[2];
  local_1c0 = (ulong)local_218[2];
  local_218[3] = iVar17;
  local_200 = 7;
  lVar25 = 0;
  do {
    if (*(char *)((long)(geom->super_CoordSys).inv_dx + lVar25 + 0x19) == '\x01') {
      iVar4 = *(int *)((long)&local_1a8 + lVar25 * 4);
      local_218[lVar25] = local_218[lVar25] - iVar4;
      local_218[lVar25 + 3] = local_218[lVar25 + 3] + iVar4;
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 3);
  auVar29._0_4_ = -(uint)((int)local_218[4] < iVar10);
  auVar29._4_4_ = -(uint)((int)local_218[5] < iVar30);
  auVar29._8_4_ = -(uint)((int)uVar12 < (int)local_218[0]);
  auVar29._12_4_ = -(uint)(iVar24 < (int)local_218[1]);
  iVar24 = movmskps(3,auVar29);
  if (((iVar24 != 0) || ((int)local_218[3] < iVar2)) || (iVar3 < (int)local_218[2])) {
    pdVar7 = (dest->super_BaseFab<double>).dptr;
    iVar2 = (dest->super_BaseFab<double>).nvar;
    uVar14 = (dest->super_BaseFab<double>).domain.smallend.vect[0];
    local_1b8 = (ulong)uVar14;
    iVar3 = (dest->super_BaseFab<double>).domain.smallend.vect[2];
    lVar22 = (long)(dest->super_BaseFab<double>).domain.smallend.vect[1];
    lVar26 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    iVar24 = (dest->super_BaseFab<double>).domain.bigend.vect[0];
    lVar19 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    lVar25 = ((long)iVar24 - (long)(int)uVar14) + 1;
    lVar27 = (lVar26 - lVar22) * lVar25;
    uVar23 = (ulong)(iVar24 + 1);
    local_148 = (geom->prob_domain).xhi[1];
    RStack_140 = (geom->prob_domain).xhi[2];
    local_158 = (geom->prob_domain).xlo[2];
    RStack_150 = (geom->prob_domain).xhi[0];
    local_168 = (geom->prob_domain).xlo[0];
    RStack_160 = (geom->prob_domain).xlo[1];
    uVar6 = *(undefined8 *)(geom->domain).bigend.vect;
    local_138 = *(undefined8 *)(geom->domain).smallend.vect;
    uStack_130 = (undefined4)*(undefined8 *)((geom->domain).smallend.vect + 2);
    uStack_12c = (undefined4)uVar6;
    uStack_128 = (undefined4)((ulong)uVar6 >> 0x20);
    uStack_124 = *(undefined8 *)((geom->domain).bigend.vect + 2);
    local_1f8 = (geom->super_CoordSys).dx[0];
    RStack_1f0 = (geom->super_CoordSys).dx[1];
    RVar1 = (geom->super_CoordSys).dx[2];
    bVar9 = (geom->super_CoordSys).field_0x51;
    uVar14 = (uint)(byte)(geom->super_CoordSys).field_0x52;
    uVar15 = (uint)(byte)(geom->super_CoordSys).field_0x53;
    pBVar8 = (bcr->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_start;
    CVar5 = (geom->super_CoordSys).c_sys;
    local_178.d_data = (BCRec *)0x0;
    local_178.h_data = (BCRec *)0x0;
    if (numcomp == 0) {
      local_260 = (BCRec *)0x0;
      bVar13 = bVar9;
    }
    else {
      local_1c8 = uVar23;
      pAVar11 = The_Pinned_Arena();
      iVar24 = (*pAVar11->_vptr_Arena[2])(pAVar11,(long)numcomp * 0x18);
      local_260 = (BCRec *)CONCAT44(extraout_var,iVar24);
      local_178.h_data = local_260;
      memcpy(local_260,pBVar8 + bcomp,(long)numcomp * 0x18);
      uVar12 = (ulong)(uint)(bx->smallend).vect[0];
      uVar23 = local_1c8;
      bVar13 = (geom->super_CoordSys).field_0x51;
    }
    lVar16 = (lVar19 - iVar3) * lVar27;
    lVar22 = (lVar22 << 0x20) + local_1b8;
    lVar26 = (lVar26 << 0x20) + uVar23;
    uVar18 = (uint)bVar9;
    iVar24 = (int)lVar19;
    if (((bVar13 & 1) == 0) && (iVar10 = (int)local_1e0, (int)uVar12 < iVar10)) {
      local_198.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      local_198._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      local_198.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
      local_198.smallend.vect[2] = (int)*(undefined8 *)((bx->smallend).vect + 2);
      local_198.bigend.vect[0] = iVar10 + -1;
      local_110.dcomp = dcomp;
      local_110.numcomp = numcomp;
      local_110.fab.p = pdVar7;
      local_110.fab.jstride = lVar25;
      local_110.fab.kstride = lVar27;
      local_110.fab.nstride = lVar16;
      local_110.fab.begin._0_8_ = lVar22;
      local_110.fab.begin.z = iVar3;
      local_110.fab.end._0_8_ = lVar26;
      local_110.fab.end.z = iVar24;
      local_110.fab.ncomp = iVar2;
      local_110.dxhi = iVar10;
      pRVar20 = &local_168;
      pGVar21 = &local_110.geomdata;
      for (lVar19 = 10; lVar19 != 0; lVar19 = lVar19 + -1) {
        (pGVar21->prob_domain).xlo[0] = *pRVar20;
        pRVar20 = pRVar20 + (ulong)bVar28 * -2 + 1;
        pGVar21 = (GeometryData *)((long)pGVar21 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      local_110.geomdata.dx[0] = local_1f8;
      local_110.geomdata.dx[1] = RStack_1f0;
      local_110.bcr_p = local_260;
      local_110.geomdata.dx[2] = RVar1;
      local_110.geomdata.is_periodic[0] = uVar18;
      local_110.geomdata.is_periodic[1] = uVar14;
      local_110.geomdata.is_periodic[2] = uVar15;
      local_110.geomdata.coord = CVar5;
      local_110.time = time;
      local_110.orig_comp = orig_comp;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMFaceFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_1_>
                (&local_198,(anon_class_224_9_3753836b *)&local_110);
      bVar13 = (geom->super_CoordSys).field_0x51;
    }
    if (((bVar13 & 1) == 0) && (iVar17 < (bx->bigend).vect[0])) {
      uVar6 = *(undefined8 *)(bx->bigend).vect;
      local_198._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      local_198.smallend.vect[2] = (int)*(undefined8 *)((bx->smallend).vect + 2);
      local_198.bigend.vect[0] = (int)uVar6;
      local_198.bigend.vect[1] = (int)((ulong)uVar6 >> 0x20);
      local_198.smallend.vect[1] = (int)((ulong)*(undefined8 *)(bx->smallend).vect >> 0x20);
      local_198.smallend.vect[0] = iVar17 + 1;
      local_110.dcomp = dcomp;
      local_110.numcomp = numcomp;
      local_110.fab.p = pdVar7;
      local_110.fab.jstride = lVar25;
      local_110.fab.kstride = lVar27;
      local_110.fab.nstride = lVar16;
      local_110.fab.begin._0_8_ = lVar22;
      local_110.fab.begin.z = iVar3;
      local_110.fab.end._0_8_ = lVar26;
      local_110.fab.end.z = iVar24;
      local_110.fab.ncomp = iVar2;
      local_110.dxhi = iVar17;
      pRVar20 = &local_168;
      pGVar21 = &local_110.geomdata;
      for (lVar19 = 10; lVar19 != 0; lVar19 = lVar19 + -1) {
        (pGVar21->prob_domain).xlo[0] = *pRVar20;
        pRVar20 = pRVar20 + (ulong)bVar28 * -2 + 1;
        pGVar21 = (GeometryData *)((long)pGVar21 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      local_110.geomdata.dx[0] = local_1f8;
      local_110.geomdata.dx[1] = RStack_1f0;
      local_110.bcr_p = local_260;
      local_110.geomdata.dx[2] = RVar1;
      local_110.geomdata.is_periodic[0] = uVar18;
      local_110.geomdata.is_periodic[1] = uVar14;
      local_110.geomdata.is_periodic[2] = uVar15;
      local_110.geomdata.coord = CVar5;
      local_110.time = time;
      local_110.orig_comp = orig_comp;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMFaceFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_2_>
                (&local_198,&local_110);
    }
    uVar12 = local_1d8;
    bVar9 = (geom->super_CoordSys).field_0x52;
    if ((bVar9 == 0) && (iVar17 = (int)local_1b0, (bx->smallend).vect[1] < iVar17)) {
      local_198.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      uVar6 = *(undefined8 *)((bx->smallend).vect + 2);
      local_198._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      local_198.smallend.vect[2] = (int)uVar6;
      local_198.bigend.vect[0] = (int)((ulong)uVar6 >> 0x20);
      local_198.bigend.vect[1] = iVar17 + -1;
      local_110.dcomp = dcomp;
      local_110.numcomp = numcomp;
      local_110.fab.p = pdVar7;
      local_110.fab.jstride = lVar25;
      local_110.fab.kstride = lVar27;
      local_110.fab.nstride = lVar16;
      local_110.fab.begin._0_8_ = lVar22;
      local_110.fab.begin.z = iVar3;
      local_110.fab.end._0_8_ = lVar26;
      local_110.fab.end.z = iVar24;
      local_110.fab.ncomp = iVar2;
      local_110.dxhi = iVar17;
      pRVar20 = &local_168;
      pGVar21 = &local_110.geomdata;
      for (lVar19 = 10; lVar19 != 0; lVar19 = lVar19 + -1) {
        (pGVar21->prob_domain).xlo[0] = *pRVar20;
        pRVar20 = pRVar20 + (ulong)bVar28 * -2 + 1;
        pGVar21 = (GeometryData *)((long)pGVar21 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      local_110.geomdata.dx[0] = local_1f8;
      local_110.geomdata.dx[1] = RStack_1f0;
      local_110.bcr_p = local_260;
      local_110.geomdata.dx[2] = RVar1;
      local_110.geomdata.is_periodic[0] = uVar18;
      local_110.geomdata.is_periodic[1] = uVar14;
      local_110.geomdata.is_periodic[2] = uVar15;
      local_110.geomdata.coord = CVar5;
      local_110.time = time;
      local_110.orig_comp = orig_comp;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMFaceFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_3_>
                (&local_198,(anon_class_224_9_9f34b04a *)&local_110);
      bVar9 = (geom->super_CoordSys).field_0x52;
    }
    iVar17 = (int)uVar12;
    if (((bVar9 & 1) == 0) && (iVar10 = (int)local_1d0, iVar10 < (bx->bigend).vect[1])) {
      uVar6 = *(undefined8 *)(bx->bigend).vect;
      local_198._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      local_198.smallend.vect[2] = (int)*(undefined8 *)((bx->smallend).vect + 2);
      local_198.bigend.vect[0] = (int)uVar6;
      local_198.bigend.vect[1] = (int)((ulong)uVar6 >> 0x20);
      local_198.smallend.vect[0] = (int)*(undefined8 *)(bx->smallend).vect;
      local_198.smallend.vect[1] = iVar10 + 1;
      local_110.dcomp = dcomp;
      local_110.numcomp = numcomp;
      local_110.fab.p = pdVar7;
      local_110.fab.jstride = lVar25;
      local_110.fab.kstride = lVar27;
      local_110.fab.nstride = lVar16;
      local_110.fab.begin._0_8_ = lVar22;
      local_110.fab.begin.z = iVar3;
      local_110.fab.end._0_8_ = lVar26;
      local_110.fab.end.z = iVar24;
      local_110.fab.ncomp = iVar2;
      local_110.dxhi = iVar10;
      pRVar20 = &local_168;
      pGVar21 = &local_110.geomdata;
      for (lVar19 = 10; lVar19 != 0; lVar19 = lVar19 + -1) {
        (pGVar21->prob_domain).xlo[0] = *pRVar20;
        pRVar20 = pRVar20 + (ulong)bVar28 * -2 + 1;
        pGVar21 = (GeometryData *)((long)pGVar21 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      local_110.geomdata.dx[0] = local_1f8;
      local_110.geomdata.dx[1] = RStack_1f0;
      local_110.bcr_p = local_260;
      local_110.geomdata.dx[2] = RVar1;
      local_110.geomdata.is_periodic[0] = uVar18;
      local_110.geomdata.is_periodic[1] = uVar14;
      local_110.geomdata.is_periodic[2] = uVar15;
      local_110.geomdata.coord = CVar5;
      local_110.time = time;
      local_110.orig_comp = orig_comp;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMFaceFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_4_>
                (&local_198,(anon_class_224_9_c15eaf8c *)&local_110);
    }
    bVar9 = (geom->super_CoordSys).field_0x53;
    if ((bVar9 == 0) && (iVar10 = (int)local_1c0, (bx->smallend).vect[2] < iVar10)) {
      local_198.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      uVar6 = *(undefined8 *)((bx->smallend).vect + 2);
      local_198.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
      local_198.smallend.vect[2] = (int)uVar6;
      local_198.bigend.vect[0] = (int)((ulong)uVar6 >> 0x20);
      local_198.btype.itype = (uint)((ulong)*(undefined8 *)((bx->bigend).vect + 2) >> 0x20);
      local_198.bigend.vect[2] = iVar10 + -1;
      local_110.dcomp = dcomp;
      local_110.numcomp = numcomp;
      local_110.fab.p = pdVar7;
      local_110.fab.jstride = lVar25;
      local_110.fab.kstride = lVar27;
      local_110.fab.nstride = lVar16;
      local_110.fab.begin._0_8_ = lVar22;
      local_110.fab.begin.z = iVar3;
      local_110.fab.end._0_8_ = lVar26;
      local_110.fab.end.z = iVar24;
      local_110.fab.ncomp = iVar2;
      local_110.dxhi = iVar10;
      pRVar20 = &local_168;
      pGVar21 = &local_110.geomdata;
      for (lVar19 = 10; lVar19 != 0; lVar19 = lVar19 + -1) {
        (pGVar21->prob_domain).xlo[0] = *pRVar20;
        pRVar20 = pRVar20 + (ulong)bVar28 * -2 + 1;
        pGVar21 = (GeometryData *)((long)pGVar21 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      local_110.geomdata.dx[0] = local_1f8;
      local_110.geomdata.dx[1] = RStack_1f0;
      local_110.bcr_p = local_260;
      local_110.geomdata.dx[2] = RVar1;
      local_110.geomdata.is_periodic[0] = uVar18;
      local_110.geomdata.is_periodic[1] = uVar14;
      local_110.geomdata.is_periodic[2] = uVar15;
      local_110.geomdata.coord = CVar5;
      local_110.time = time;
      local_110.orig_comp = orig_comp;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMFaceFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_5_>
                (&local_198,(anon_class_224_9_0715dd29 *)&local_110);
      bVar9 = (geom->super_CoordSys).field_0x53;
    }
    if (((bVar9 & 1) == 0) && (iVar17 < (bx->bigend).vect[2])) {
      local_198.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      uVar6 = *(undefined8 *)(bx->bigend).vect;
      local_198._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      local_198.bigend.vect[0] = (int)uVar6;
      local_198.bigend.vect[1] = (int)((ulong)uVar6 >> 0x20);
      local_198.smallend.vect[2] = iVar17 + 1;
      local_110.dcomp = dcomp;
      local_110.numcomp = numcomp;
      local_110.fab.p = pdVar7;
      local_110.fab.jstride = lVar25;
      local_110.fab.kstride = lVar27;
      local_110.fab.nstride = lVar16;
      local_110.fab.begin._0_8_ = lVar22;
      local_110.fab.begin.z = iVar3;
      local_110.fab.end._0_8_ = lVar26;
      local_110.fab.end.z = iVar24;
      local_110.fab.ncomp = iVar2;
      local_110.dxhi = iVar17;
      pRVar20 = &local_168;
      pGVar21 = &local_110.geomdata;
      for (lVar25 = 10; lVar25 != 0; lVar25 = lVar25 + -1) {
        (pGVar21->prob_domain).xlo[0] = *pRVar20;
        pRVar20 = pRVar20 + (ulong)bVar28 * -2 + 1;
        pGVar21 = (GeometryData *)((long)pGVar21 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      local_110.geomdata.dx[0] = local_1f8;
      local_110.geomdata.dx[1] = RStack_1f0;
      local_110.bcr_p = local_260;
      local_110.geomdata.dx[2] = RVar1;
      local_110.geomdata.is_periodic[0] = uVar18;
      local_110.geomdata.is_periodic[1] = uVar14;
      local_110.geomdata.is_periodic[2] = uVar15;
      local_110.geomdata.coord = CVar5;
      local_110.time = time;
      local_110.orig_comp = orig_comp;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMFaceFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_6_>
                (&local_198,(anon_class_224_9_293fdc6b *)&local_110);
    }
    Gpu::AsyncArray<amrex::BCRec,_0>::~AsyncArray(&local_178);
  }
  return;
}

Assistant:

void
GpuBndryFuncFab<F>::nddoit (Box const& bx, FArrayBox& dest,
                            const int dcomp, const int numcomp,
                            Geometry const& geom, const Real time,
                            const Vector<BCRec>& bcr, const int bcomp,
                            const int orig_comp)
{
    const IntVect& len = bx.length();

    Box const& domain = amrex::convert(geom.Domain(),IntVect::TheNodeVector());
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (geom.isPeriodic(idim)) {
            gdomain.grow(idim,len[idim]);
        }
    }

    if (gdomain.contains(bx)) return;

    Array4<Real> const& fab = dest.array();
    const auto geomdata = geom.data();

    AsyncArray<BCRec> bcr_aa(bcr.data()+bcomp, numcomp);
    BCRec* bcr_p = bcr_aa.data();

    const auto f_user = m_user_f;

    // xlo
    if (!geom.isPeriodic(0) && bx.smallEnd(0) < domain.smallEnd(0)) {
        Box bndry = bx;
        int dxlo = domain.smallEnd(0);
        bndry.setBig(0,dxlo-1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(dxlo,j,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

    // xhi
    if (!geom.isPeriodic(0) && bx.bigEnd(0) > domain.bigEnd(0)) {
        Box bndry = bx;
        int dxhi = domain.bigEnd(0);
        bndry.setSmall(0,dxhi+1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(dxhi,j,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

#if (AMREX_SPACEDIM >= 2)
    // ylo
    if (!geom.isPeriodic(1) && bx.smallEnd(1) < domain.smallEnd(1)) {
        Box bndry = bx;
        int dylo = domain.smallEnd(1);
        bndry.setBig(1,dylo-1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,dylo,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

    // yhi
    if (!geom.isPeriodic(1) && bx.bigEnd(1) > domain.bigEnd(1)) {
        Box bndry = bx;
        int dyhi = domain.bigEnd(1);
        bndry.setSmall(1,dyhi+1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,dyhi,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }
#endif

#if (AMREX_SPACEDIM == 3)
    // zlo
    if (!geom.isPeriodic(2) && bx.smallEnd(2) < domain.smallEnd(2)) {
        Box bndry = bx;
        int dzlo = domain.smallEnd(2);
        bndry.setBig(2,dzlo-1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,j,dzlo,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

    // zhi
    if (!geom.isPeriodic(2) && bx.bigEnd(2) > domain.bigEnd(2)) {
        Box bndry = bx;
        int dzhi = domain.bigEnd(2);
        bndry.setSmall(2,dzhi+1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,j,dzhi,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }
#endif
}